

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

bool google::protobuf::compiler::java::anon_unknown_10::BitfieldTracksMutability
               (FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  FieldDescriptor *descriptor_local;
  
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if ((!bVar1) || (bVar1 = IsMapField(descriptor), bVar1)) {
    descriptor_local._7_1_ = false;
  }
  else {
    TVar2 = FieldDescriptor::type(descriptor);
    if ((TVar2 - TYPE_GROUP < 2) || (TVar2 == TYPE_ENUM)) {
      descriptor_local._7_1_ = true;
    }
    else {
      descriptor_local._7_1_ = false;
    }
  }
  return descriptor_local._7_1_;
}

Assistant:

bool BitfieldTracksMutability(const FieldDescriptor* const descriptor) {
  if (!descriptor->is_repeated() || IsMapField(descriptor)) {
    return false;
  }
  // TODO: update this to migrate repeated fields to use
  // ProtobufList (which tracks immutability internally). That allows us to use
  // the presence bit to skip work on the repeated field if it is not populated.
  // Once all repeated fields are held in ProtobufLists, this method shouldn't
  // be needed.
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_ENUM:
      return true;
    default:
      return false;
  }
}